

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

int append(void)

{
  int iVar1;
  char *local_28;
  char *url;
  long lStack_18;
  int error;
  CURLU *urlp;
  CURLUcode rc;
  int i;
  
  url._4_4_ = 0;
  urlp._4_4_ = 0;
  while( true ) {
    if (append_list[urlp._4_4_].in == (char *)0x0 || url._4_4_ != 0) {
      return url._4_4_;
    }
    lStack_18 = curl_url();
    if (lStack_18 == 0) break;
    urlp._0_4_ = curl_url_set(lStack_18,0,append_list[urlp._4_4_].in,
                              append_list[urlp._4_4_].urlflags);
    if ((CURLUcode)urlp == CURLUE_OK) {
      urlp._0_4_ = curl_url_set(lStack_18,8,append_list[urlp._4_4_].q,
                                append_list[urlp._4_4_].qflags | 0x100);
    }
    else {
      url._4_4_ = url._4_4_ + 1;
    }
    if (url._4_4_ == 0) {
      if ((CURLUcode)urlp == append_list[urlp._4_4_].ucode) {
        if (append_list[urlp._4_4_].ucode == CURLUE_OK) {
          urlp._0_4_ = curl_url_get(lStack_18,0,&local_28);
          if ((CURLUcode)urlp == CURLUE_OK) {
            iVar1 = checkurl(local_28,append_list[urlp._4_4_].out);
            if (iVar1 != 0) {
              url._4_4_ = url._4_4_ + 1;
            }
            curl_free(local_28);
          }
          else {
            curl_mfprintf(_stderr,"%s:%d Get URL returned %d\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1560.c"
                          ,0x309,(CURLUcode)urlp);
            url._4_4_ = url._4_4_ + 1;
          }
        }
      }
      else {
        curl_mfprintf(_stderr,"Append\nin: %s\nreturned %d (expected %d)\n",
                      append_list[urlp._4_4_].in,(CURLUcode)urlp,append_list[urlp._4_4_].ucode);
        url._4_4_ = url._4_4_ + 1;
      }
    }
    curl_url_cleanup(lStack_18);
    urlp._4_4_ = urlp._4_4_ + 1;
  }
  return url._4_4_ + 1;
}

Assistant:

static int append(void)
{
  int i;
  CURLUcode rc;
  CURLU *urlp;
  int error = 0;
  for(i = 0; append_list[i].in && !error; i++) {
    urlp = curl_url();
    if(!urlp) {
      error++;
      break;
    }
    rc = curl_url_set(urlp, CURLUPART_URL,
                      append_list[i].in,
                      append_list[i].urlflags);
    if(rc)
      error++;
    else
      rc = curl_url_set(urlp, CURLUPART_QUERY,
                        append_list[i].q,
                        append_list[i].qflags | CURLU_APPENDQUERY);
    if(error)
      ;
    else if(rc != append_list[i].ucode) {
      fprintf(stderr, "Append\nin: %s\nreturned %d (expected %d)\n",
              append_list[i].in, (int)rc, append_list[i].ucode);
      error++;
    }
    else if(append_list[i].ucode) {
      /* the expected error happened */
    }
    else {
      char *url;
      rc = curl_url_get(urlp, CURLUPART_URL, &url, 0);
      if(rc) {
        fprintf(stderr, "%s:%d Get URL returned %d\n",
                __FILE__, __LINE__, (int)rc);
        error++;
      }
      else {
        if(checkurl(url, append_list[i].out)) {
          error++;
        }
        curl_free(url);
      }
    }
    curl_url_cleanup(urlp);
  }
  return error;
}